

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

int Mpm_CutCreate(Mpm_Man_t *p,Mpm_Cut_t *pUni,Mpm_Cut_t **ppCut)

{
  int iVar1;
  
  iVar1 = Mpm_CutAlloc(p,*(uint *)&pUni->field_0x4 >> 0x1b,ppCut);
  *(uint *)&(*ppCut)->field_0x4 =
       *(uint *)&(*ppCut)->field_0x4 & 0xfe000000 | *(uint *)&pUni->field_0x4 & 0x1ffffff;
  *(uint *)&(*ppCut)->field_0x4 =
       *(uint *)&(*ppCut)->field_0x4 & 0xfdffffff | *(uint *)&pUni->field_0x4 & 0x2000000;
  *(uint *)&(*ppCut)->field_0x4 =
       *(uint *)&(*ppCut)->field_0x4 & 0xfbffffff | *(uint *)&pUni->field_0x4 & 0x4000000;
  *(uint *)&(*ppCut)->field_0x4 =
       *(uint *)&(*ppCut)->field_0x4 & 0x7ffffff | *(uint *)&pUni->field_0x4 & 0xf8000000;
  memcpy((*ppCut)->pLeaves,pUni->pLeaves,(ulong)(*(uint *)&pUni->field_0x4 >> 0x19 & 0xfffffffc));
  return iVar1;
}

Assistant:

static inline int Mpm_CutCreate( Mpm_Man_t * p, Mpm_Cut_t * pUni, Mpm_Cut_t ** ppCut )  
{ 
    int hCutNew = Mpm_CutAlloc( p, pUni->nLeaves, ppCut );
    (*ppCut)->iFunc    = pUni->iFunc;
    (*ppCut)->fCompl   = pUni->fCompl;
    (*ppCut)->fUseless = pUni->fUseless;
    (*ppCut)->nLeaves  = pUni->nLeaves;
    memcpy( (*ppCut)->pLeaves, pUni->pLeaves, sizeof(int) * pUni->nLeaves );
    return hCutNew;
}